

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O2

string * core::image::anon_unknown_0::debug_print<int>
                   (string *__return_storage_ptr__,int *value,string *extra)

{
  string local_40;
  
  if (*value < 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"<not set>",(allocator *)&local_40);
  }
  else {
    util::string::get<int>(&local_40,value);
    std::operator+(__return_storage_ptr__,&local_40,extra);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    debug_print (T const& value, std::string extra = "")
    {
        if (value < T(0))
            return "<not set>";
        else
            return util::string::get(value) + extra;
    }